

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

bool __thiscall
testing::internal::FloatingPoint<double>::AlmostEquals
          (FloatingPoint<double> *this,FloatingPoint<double> *rhs)

{
  bool bVar1;
  Bits BVar2;
  FloatingPoint<double> *rhs_local;
  FloatingPoint<double> *this_local;
  
  bVar1 = is_nan(this);
  if ((!bVar1) && (bVar1 = is_nan(rhs), !bVar1)) {
    BVar2 = DistanceBetweenSignAndMagnitudeNumbers((Bits *)this,(Bits *)rhs);
    return BVar2 < 5;
  }
  return false;
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }